

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

bool __thiscall AmpIO::SetAmpEnableMask(AmpIO *this,uint32_t mask,uint32_t state)

{
  uint32_t uVar1;
  uint uVar2;
  uint index;
  
  uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar1 < 8) {
    this->WriteBuffer[this->WB_CTRL_OFFSET] =
         mask << 8 | state | ~mask & this->WriteBuffer[this->WB_CTRL_OFFSET];
  }
  else {
    uVar2 = this->NumMotors;
    if (uVar2 != 0) {
      index = 0;
      do {
        if ((mask >> (index & 0x1f) & 1) != 0) {
          SetAmpEnable(this,index,(1 << ((byte)index & 0x1f) & state) != 0);
          uVar2 = this->NumMotors;
        }
        index = index + 1;
      } while (index < uVar2);
    }
  }
  return true;
}

Assistant:

bool AmpIO::SetAmpEnableMask(uint32_t mask, uint32_t state)
{
    if (GetFirmwareVersion() < 8) {
        uint32_t enable_mask = static_cast<uint32_t>(mask) << 8;
        uint32_t state_clr_mask = static_cast<uint32_t>(mask);
        uint32_t state_set_mask = static_cast<uint32_t>(state);
        // Following will correctly handle case where SetAmpEnable/SetAmpEnableMask is called multiple times,
        // with different masks
        WriteBuffer[WB_CTRL_OFFSET] = (WriteBuffer[WB_CTRL_OFFSET]&(~state_clr_mask)) | enable_mask | state_set_mask;
    }
    else {
        for (unsigned int i = 0; i < NumMotors; i++) {
            if ((mask >> i) & 1)
                SetAmpEnable(i, (state >> i) & 1);
        }
    }
    return true;
}